

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall JSON::Parser::Parser(Parser *this,string *input)

{
  int iVar1;
  string *input_local;
  Parser *this_local;
  
  this->pos = 0;
  Token::Token(&this->currentToken);
  Token::Token(&this->lastToken);
  std::__cxx11::string::string((string *)&this->input,(string *)input);
  Node::Node(&this->ast);
  iVar1 = std::__cxx11::string::length();
  this->length = iVar1;
  return;
}

Assistant:

Parser::Parser(const string &input) : input(input) {
        length = input.length();
    }